

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS
ref_smooth_local_cell_about
          (REF_CELL ref_cell,REF_NODE ref_node,REF_INT about_node,REF_BOOL *allowed)

{
  REF_INT local_48;
  REF_INT local_44;
  int local_40;
  int local_3c;
  REF_INT local_38;
  REF_INT node;
  REF_INT cell;
  REF_INT item;
  REF_BOOL *allowed_local;
  REF_INT about_node_local;
  REF_NODE ref_node_local;
  REF_CELL ref_cell_local;
  
  *allowed = 0;
  if ((about_node < 0) || (ref_cell->ref_adj->nnode <= about_node)) {
    local_40 = -1;
  }
  else {
    local_40 = ref_cell->ref_adj->first[about_node];
  }
  node = local_40;
  if (local_40 == -1) {
    local_44 = -1;
  }
  else {
    local_44 = ref_cell->ref_adj->item[local_40].ref;
  }
  local_38 = local_44;
  do {
    if (node == -1) {
      *allowed = 1;
      return 0;
    }
    for (local_3c = 0; local_3c < ref_cell->node_per; local_3c = local_3c + 1) {
      if (ref_node->ref_mpi->id !=
          ref_node->part[ref_cell->c2n[local_3c + ref_cell->size_per * local_38]]) {
        return 0;
      }
    }
    node = ref_cell->ref_adj->item[node].next;
    if (node == -1) {
      local_48 = -1;
    }
    else {
      local_48 = ref_cell->ref_adj->item[node].ref;
    }
    local_38 = local_48;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_local_cell_about(REF_CELL ref_cell,
                                                      REF_NODE ref_node,
                                                      REF_INT about_node,
                                                      REF_BOOL *allowed) {
  REF_INT item, cell, node;

  *allowed = REF_FALSE;

  each_ref_cell_having_node(ref_cell, about_node, item, cell) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        return REF_SUCCESS;
      }
    }
  }
  *allowed = REF_TRUE;

  return REF_SUCCESS;
}